

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_memory.h
# Opt level: O1

void * mk_mem_alloc(size_t size)

{
  void *pvVar1;
  
  pvVar1 = malloc(size);
  if (size == 0 || pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  perror("malloc");
}

Assistant:

static inline ALLOCSZ_ATTR(1)
void *mk_mem_alloc(const size_t size)
{
#ifdef MALLOC_JEMALLOC
    void *aux = je_malloc(size);
#else
    void *aux = malloc(size);
#endif

    if (mk_unlikely(!aux && size)) {
        perror("malloc");
        return NULL;
    }

    return aux;
}